

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

PartitionedSubscripts * __thiscall
spvtools::opt::LoopDependenceAnalysis::PartitionSubscripts
          (PartitionedSubscripts *__return_storage_ptr__,LoopDependenceAnalysis *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *source_subscripts,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *destination_subscripts)

{
  Loop *pLVar1;
  anon_class_16_2_3f78c113_for__M_pred __pred;
  initializer_list<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> __l;
  bool bVar2;
  const_reference __a;
  const_reference __b;
  reference ppLVar3;
  value_type *pvVar4;
  set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
  *this_00;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  local_150;
  const_iterator local_148;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *local_138;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *local_130;
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_*,_std::vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>_>
  local_128;
  const_iterator local_120;
  _Base_ptr local_118;
  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
  local_110;
  _Self local_108;
  undefined1 local_f9;
  Loop *pLStack_f8;
  bool has_loop;
  LoopDependenceAnalysis *local_f0;
  _Base_ptr local_e8;
  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
  local_e0;
  _Self local_d8;
  _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> it
  ;
  value_type *current_partition;
  size_t j;
  int64_t k;
  Loop *loop;
  iterator __end2;
  iterator __begin2;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> *__range2;
  pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*> local_90;
  iterator local_80;
  size_type local_78;
  set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  local_70;
  ulong local_40;
  size_t i;
  size_type num_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_28;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *destination_subscripts_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *source_subscripts_local;
  LoopDependenceAnalysis *this_local;
  PartitionedSubscripts *partitions;
  
  num_subscripts._7_1_ = 0;
  local_28 = destination_subscripts;
  destination_subscripts_local = source_subscripts;
  source_subscripts_local =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)this;
  this_local = (LoopDependenceAnalysis *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::vector(__return_storage_ptr__);
  i = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::size
                (destination_subscripts_local);
  for (local_40 = 0; local_40 < i; local_40 = local_40 + 1) {
    __a = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          operator[](destination_subscripts_local,local_40);
    __b = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          operator[](local_28,local_40);
    std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>::
    pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_true>(&local_90,__a,__b);
    local_80 = &local_90;
    local_78 = 1;
    std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>::
    allocator((allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> *)
              ((long)&__range2 + 6));
    __l._M_len = local_78;
    __l._M_array = local_80;
    std::
    set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
    ::set(&local_70,__l,
          (less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> *)
          ((long)&__range2 + 7),(allocator_type *)((long)&__range2 + 6));
    std::
    vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
    ::push_back(__return_storage_ptr__,&local_70);
    std::
    set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
    ::~set(&local_70);
    std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>::
    ~allocator((allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_> *)
               ((long)&__range2 + 6));
  }
  __end2 = std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
           begin(&this->loops_);
  loop = (Loop *)std::
                 vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
                 end(&this->loops_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_spvtools::opt::Loop_**,_std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>_>
                                     *)&loop), bVar2) {
    ppLVar3 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::Loop_**,_std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>_>
              ::operator*(&__end2);
    pLVar1 = *ppLVar3;
    j = 0xffffffffffffffff;
    for (current_partition = (value_type *)0x0;
        pvVar4 = (value_type *)
                 std::
                 vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                 ::size(__return_storage_ptr__), current_partition < pvVar4;
        current_partition = (value_type *)&(current_partition->_M_t)._M_impl.field_0x1) {
      it._M_node = (_Base_ptr)
                   std::
                   vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                   ::operator[](__return_storage_ptr__,(size_type)current_partition);
      local_e0._M_node =
           (_Base_ptr)
           std::
           set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
           ::begin((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                    *)it._M_node);
      local_e8 = (_Base_ptr)
                 std::
                 set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                 ::end(it._M_node);
      __pred.this = this;
      __pred.loop = pLVar1;
      pLStack_f8 = pLVar1;
      local_f0 = this;
      local_d8._M_node =
           (_Base_ptr)
           std::
           find_if<std::_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,spvtools::opt::LoopDependenceAnalysis::PartitionSubscripts(std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>const&,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>const&)::__0>
                     (local_e0,(_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                                )local_e8,__pred);
      local_108._M_node =
           (_Base_ptr)
           std::
           set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
           ::end(it._M_node);
      local_f9 = std::operator!=(&local_d8,&local_108);
      if ((bool)local_f9) {
        if (j == 0xffffffffffffffff) {
          j = (size_t)current_partition;
        }
        else {
          this_00 = (set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                     *)std::
                       vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                       ::operator[](__return_storage_ptr__,j);
          local_110._M_node =
               (_Base_ptr)
               std::
               set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
               ::begin(it._M_node);
          local_118 = (_Base_ptr)
                      std::
                      set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                      ::end(it._M_node);
          std::
          set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
          ::
          insert<std::_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>
                    (this_00,local_110,
                     (_Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>
                      )local_118);
          std::
          set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
          ::clear((set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                   *)it._M_node);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::Loop_**,_std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>_>
    ::operator++(&__end2);
  }
  local_130 = (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
               *)std::
                 vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                 ::begin(__return_storage_ptr__);
  local_138 = (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
               *)std::
                 vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                 ::end(__return_storage_ptr__);
  local_128 = std::
              remove_if<__gnu_cxx::__normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>,spvtools::opt::LoopDependenceAnalysis::PartitionSubscripts(std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>const&,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>const&)::__1>
                        (local_130,local_138);
  __gnu_cxx::
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>const*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
  ::
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>*>
            ((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>const*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
              *)&local_120,&local_128);
  local_150._M_current =
       (set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        *)std::
          vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
          ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>const*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
  ::
  __normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>*>
            ((__normal_iterator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>const*,std::vector<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>,std::allocator<std::set<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>,std::less<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>,std::allocator<std::pair<spvtools::opt::Instruction*,spvtools::opt::Instruction*>>>>>>
              *)&local_148,&local_150);
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::erase(__return_storage_ptr__,local_120,local_148);
  return __return_storage_ptr__;
}

Assistant:

PartitionedSubscripts LoopDependenceAnalysis::PartitionSubscripts(
    const std::vector<Instruction*>& source_subscripts,
    const std::vector<Instruction*>& destination_subscripts) {
  PartitionedSubscripts partitions{};

  auto num_subscripts = source_subscripts.size();

  // Create initial partitions with one subscript pair per partition.
  for (size_t i = 0; i < num_subscripts; ++i) {
    partitions.push_back({{source_subscripts[i], destination_subscripts[i]}});
  }

  // Iterate over the loops to create all partitions
  for (auto loop : loops_) {
    int64_t k = -1;

    for (size_t j = 0; j < partitions.size(); ++j) {
      auto& current_partition = partitions[j];

      // Does |loop| appear in |current_partition|
      auto it = std::find_if(
          current_partition.begin(), current_partition.end(),
          [loop,
           this](const std::pair<Instruction*, Instruction*>& elem) -> bool {
            auto source_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<0>(elem))
                    ->CollectRecurrentNodes();
            auto destination_recurrences =
                scalar_evolution_.AnalyzeInstruction(std::get<1>(elem))
                    ->CollectRecurrentNodes();

            source_recurrences.insert(source_recurrences.end(),
                                      destination_recurrences.begin(),
                                      destination_recurrences.end());

            auto loops_in_pair = CollectLoops(source_recurrences);
            auto end_it = loops_in_pair.end();

            return std::find(loops_in_pair.begin(), end_it, loop) != end_it;
          });

      auto has_loop = it != current_partition.end();

      if (has_loop) {
        if (k == -1) {
          k = j;
        } else {
          // Add |partitions[j]| to |partitions[k]| and discard |partitions[j]|
          partitions[static_cast<size_t>(k)].insert(current_partition.begin(),
                                                    current_partition.end());
          current_partition.clear();
        }
      }
    }
  }

  // Remove empty (discarded) partitions
  partitions.erase(
      std::remove_if(
          partitions.begin(), partitions.end(),
          [](const std::set<std::pair<Instruction*, Instruction*>>& partition) {
            return partition.empty();
          }),
      partitions.end());

  return partitions;
}